

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Abc_Obj_t * Abc_NodeFromMapPhase_rec(Abc_Ntk_t *pNtkNew,Map_Node_t *pNodeMap,int fPhase)

{
  int iVar1;
  uint uVar2;
  uint nNodePis;
  Map_Cut_t *pMVar3;
  Abc_Obj_t *pAVar4;
  Map_Super_t *pSuper;
  Map_Node_t **ppMVar5;
  ulong uVar6;
  ulong uVar7;
  Abc_Obj_t *pNodePIs [10];
  Abc_Obj_t *local_88 [11];
  
  pMVar3 = Map_NodeReadCutBest(pNodeMap,fPhase);
  if (pMVar3 == (Map_Cut_t *)0x0) {
    iVar1 = Map_NodeIsConst(pNodeMap);
    if (iVar1 == 0) {
      __assert_fail("Map_NodeReadCutBest(pNodeMap, fPhase) != NULL || Map_NodeIsConst(pNodeMap)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                    ,0x19a,"Abc_Obj_t *Abc_NodeFromMapPhase_rec(Abc_Ntk_t *, Map_Node_t *, int)");
    }
  }
  pAVar4 = (Abc_Obj_t *)Map_NodeReadData(pNodeMap,fPhase);
  if (pAVar4 == (Abc_Obj_t *)0x0) {
    pMVar3 = Map_NodeReadCutBest(pNodeMap,fPhase);
    pSuper = Map_CutReadSuperBest(pMVar3,fPhase);
    uVar2 = Map_CutReadPhaseBest(pMVar3,fPhase);
    nNodePis = Map_CutReadLeavesNum(pMVar3);
    ppMVar5 = Map_CutReadLeaves(pMVar3);
    uVar7 = 0;
    uVar6 = (ulong)nNodePis;
    if ((int)nNodePis < 1) {
      uVar6 = uVar7;
    }
    while (uVar6 != uVar7) {
      pAVar4 = Abc_NodeFromMap_rec(pNtkNew,ppMVar5[uVar7],
                                   (uint)((~uVar2 >> ((uint)uVar7 & 0x1f) & 1) != 0));
      local_88[uVar7] = pAVar4;
      uVar7 = uVar7 + 1;
      if (pAVar4 == (Abc_Obj_t *)0x0) {
        __assert_fail("pNodePIs[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                      ,0x1ac,"Abc_Obj_t *Abc_NodeFromMapPhase_rec(Abc_Ntk_t *, Map_Node_t *, int)");
      }
    }
    pAVar4 = Abc_NodeFromMapSuper_rec(pNtkNew,pNodeMap,pSuper,local_88,nNodePis);
    Map_NodeSetData(pNodeMap,fPhase,(char *)pAVar4);
  }
  return pAVar4;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMapPhase_rec( Abc_Ntk_t * pNtkNew, Map_Node_t * pNodeMap, int fPhase )
{
    Abc_Obj_t * pNodePIs[10];
    Abc_Obj_t * pNodeNew;
    Map_Node_t ** ppLeaves;
    Map_Cut_t * pCutBest;
    Map_Super_t * pSuperBest;
    unsigned uPhaseBest;
    int i, fInvPin, nLeaves;

    // make sure the node can be implemented in this phase
    assert( Map_NodeReadCutBest(pNodeMap, fPhase) != NULL || Map_NodeIsConst(pNodeMap) );
    // check if the phase is already implemented
    pNodeNew = (Abc_Obj_t *)Map_NodeReadData( pNodeMap, fPhase );
    if ( pNodeNew )
        return pNodeNew;

    // get the information about the best cut 
    pCutBest   = Map_NodeReadCutBest( pNodeMap, fPhase );
    pSuperBest = Map_CutReadSuperBest( pCutBest, fPhase );
    uPhaseBest = Map_CutReadPhaseBest( pCutBest, fPhase );
    nLeaves    = Map_CutReadLeavesNum( pCutBest );
    ppLeaves   = Map_CutReadLeaves( pCutBest );

    // collect the PI nodes
    for ( i = 0; i < nLeaves; i++ )
    {
        fInvPin = ((uPhaseBest & (1 << i)) > 0);
        pNodePIs[i] = Abc_NodeFromMap_rec( pNtkNew, ppLeaves[i], !fInvPin );
        assert( pNodePIs[i] != NULL );
    }

    // implement the supergate
    pNodeNew = Abc_NodeFromMapSuper_rec( pNtkNew, pNodeMap, pSuperBest, pNodePIs, nLeaves );
    Map_NodeSetData( pNodeMap, fPhase, (char *)pNodeNew );
    return pNodeNew;
}